

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

TokenOrSyntax * __thiscall
slang::syntax::StatementSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,StatementSyntax *this,size_t index)

{
  Token local_20;
  
  if (index == 1) {
    *(SyntaxNode **)
     &(__return_storage_ptr__->super_ConstTokenOrSyntax).
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         &(this->attributes).super_SyntaxListBase.super_SyntaxNode;
  }
  else {
    if (index != 0) {
      parsing::Token::Token(&local_20);
      *(undefined8 *)
       &(__return_storage_ptr__->super_ConstTokenOrSyntax).
        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
           local_20._0_8_;
      *(Info **)((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
                        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                + 8) = local_20.info;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
               super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
       0x10) = '\0';
      return __return_storage_ptr__;
    }
    *(NamedLabelSyntax **)
     &(__return_storage_ptr__->super_ConstTokenOrSyntax).
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = this->label
    ;
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10)
       = '\x01';
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax StatementSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        default: return nullptr;
    }
}